

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

sunrealtype N_VMinLocal_ManyVector(N_Vector x)

{
  sunindextype i;
  long lVar1;
  sunrealtype sVar2;
  double dVar3;
  
  sVar2 = 1.79769313486232e+308;
  for (lVar1 = 0; lVar1 < *x->content; lVar1 = lVar1 + 1) {
    if (*(long *)(*(long *)(*(long *)(*(long *)((long)x->content + 0x10) + lVar1 * 8) + 8) + 0x150)
        == 0) {
      dVar3 = (double)N_VMin();
    }
    else {
      dVar3 = (double)N_VMinLocal();
    }
    if (dVar3 <= sVar2) {
      sVar2 = dVar3;
    }
  }
  return sVar2;
}

Assistant:

sunrealtype MVAPPEND(N_VMinLocal)(N_Vector x)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;
  sunrealtype min, lmin;

  /* initialize output*/
  min = SUN_BIG_REAL;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* check for nvminlocal in subvector */
    if (MANYVECTOR_SUBVEC(x, i)->ops->nvminlocal)
    {
      lmin = N_VMinLocal(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;

      /* otherwise, call nvmin and accumulate to overall min */
    }
    else
    {
      lmin = N_VMin(MANYVECTOR_SUBVEC(x, i));
      SUNCheckLastErrNoRet();
      min = (min < lmin) ? min : lmin;
    }
  }

  return (min);
}